

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::prepare_int_buffer<fmt::AlignSpec>
          (BasicWriter<wchar_t> *this,uint num_digits,AlignSpec *spec,char *prefix,uint prefix_size)

{
  uint uVar1;
  Alignment prefix_size_00;
  wchar_t value;
  int iVar2;
  int value_00;
  Type TVar3;
  uint uVar4;
  uint uVar5;
  CharPtr pwVar6;
  AlignSpec *in_RCX;
  AlignSpec *in_RDX;
  int in_ESI;
  Buffer<wchar_t> *in_RDI;
  int in_R8D;
  CharPtr end;
  CharPtr p;
  CharPtr p_3;
  uint size;
  CharPtr p_2;
  CharPtr result;
  CharPtr p_1;
  uint fill_size;
  AlignSpec subspec;
  uint number_size;
  wchar_t fill;
  Alignment align;
  uint width;
  undefined4 in_stack_ffffffffffffff68;
  wchar_t *in_stack_ffffffffffffff78;
  wchar_t *__last;
  AlignSpec *in_stack_ffffffffffffff80;
  wchar_t *__first;
  undefined8 in_stack_ffffffffffffff88;
  wchar_t fill_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  CharPtr in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffe8;
  CharPtr local_8;
  
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  fill_00 = (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar1 = WidthSpec::width(&in_RDX->super_WidthSpec);
  prefix_size_00 = AlignSpec::align(in_RDX);
  value = WidthSpec::fill(&in_RDX->super_WidthSpec);
  internal::BasicCharTraits<wchar_t>::cast(value);
  iVar2 = AlignSpec::precision(in_RDX);
  if (in_ESI < iVar2) {
    if ((in_R8D != 0) &&
       (*(char *)((long)&(in_RCX->super_WidthSpec).width_ + (ulong)(in_R8D - 1)) == '0')) {
      in_R8D = in_R8D + -1;
    }
    iVar2 = in_R8D;
    value_00 = AlignSpec::precision(in_RDX);
    uVar5 = (uint)((ulong)in_RDX >> 0x20);
    TVar3 = internal::to_unsigned<int>(value_00);
    uVar4 = in_R8D + TVar3;
    AlignSpec::AlignSpec
              (in_stack_ffffffffffffff80,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (wchar_t)in_stack_ffffffffffffff78,(Alignment)((ulong)in_RDI >> 0x20));
    if (uVar4 < uVar1) {
      Buffer<wchar_t>::reserve(in_RDI,CONCAT44(in_R8D,in_stack_ffffffffffffff68));
      if (prefix_size_00 != ALIGN_LEFT) {
        grow_buffer((BasicWriter<wchar_t> *)in_stack_ffffffffffffff80,
                    (size_t)in_stack_ffffffffffffff78);
        std::uninitialized_fill<wchar_t*,wchar_t>
                  ((wchar_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(wchar_t *)in_RDI)
        ;
      }
      local_8 = prepare_int_buffer<fmt::AlignSpec>
                          ((BasicWriter<wchar_t> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar5,
                           in_RCX,(char *)CONCAT44(iVar2,uVar1),prefix_size_00);
      if (prefix_size_00 == ALIGN_LEFT) {
        grow_buffer((BasicWriter<wchar_t> *)in_stack_ffffffffffffff80,
                    (size_t)in_stack_ffffffffffffff78);
        std::uninitialized_fill<wchar_t*,wchar_t>
                  ((wchar_t *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(wchar_t *)in_RDI)
        ;
      }
    }
    else {
      local_8 = prepare_int_buffer<fmt::AlignSpec>
                          ((BasicWriter<wchar_t> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar5,
                           in_RCX,(char *)CONCAT44(iVar2,uVar1),prefix_size_00);
    }
  }
  else {
    uVar5 = in_R8D + in_ESI;
    if (uVar5 < uVar1) {
      pwVar6 = grow_buffer((BasicWriter<wchar_t> *)in_stack_ffffffffffffff80,
                           (size_t)in_stack_ffffffffffffff78);
      __last = pwVar6 + uVar1;
      if (prefix_size_00 == ALIGN_LEFT) {
        std::uninitialized_copy<char_const*,wchar_t*>
                  ((char *)pwVar6,(char *)__last,(wchar_t *)in_RDI);
        __first = pwVar6 + uVar5;
        std::uninitialized_fill<wchar_t*,wchar_t>(__first,__last,(wchar_t *)in_RDI);
        __last = __first;
      }
      else if (prefix_size_00 == ALIGN_CENTER) {
        pwVar6 = fill_padding(in_stack_ffffffffffffffa0,uVar4,
                              CONCAT44(uVar5,in_stack_ffffffffffffff90),fill_00);
        std::uninitialized_copy<char_const*,wchar_t*>
                  ((char *)pwVar6,(char *)__last,(wchar_t *)in_RDI);
        __last = pwVar6 + uVar5;
      }
      else {
        if (prefix_size_00 == ALIGN_NUMERIC) {
          if (in_R8D != 0) {
            pwVar6 = std::uninitialized_copy<char_const*,wchar_t*>
                               ((char *)pwVar6,(char *)__last,(wchar_t *)in_RDI);
          }
        }
        else {
          std::uninitialized_copy<char_const*,wchar_t*>
                    ((char *)pwVar6,(char *)__last,(wchar_t *)in_RDI);
        }
        std::uninitialized_fill<wchar_t*,wchar_t>(pwVar6,__last,(wchar_t *)in_RDI);
      }
      local_8 = __last + -1;
    }
    else {
      local_8 = grow_buffer((BasicWriter<wchar_t> *)in_stack_ffffffffffffff80,
                            (size_t)in_stack_ffffffffffffff78);
      std::uninitialized_copy<char_const*,wchar_t*>
                ((char *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 (wchar_t *)in_RDI);
      local_8 = local_8 + ((ulong)uVar5 - 1);
    }
  }
  return local_8;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}